

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

int If_CutPerformCheck07(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  uint uVar1;
  word wVar2;
  byte bVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  bool bVar14;
  word *tLimit;
  word t [2];
  word local_48;
  undefined8 local_40;
  
  if (0 < nLeaves) {
    iVar6 = nVars + -6;
    uVar8 = 1 << ((byte)iVar6 & 0x1f);
    uVar1 = uVar8;
    if ((int)uVar8 < 2) {
      uVar1 = 1;
    }
    uVar7 = 0;
    uVar4 = 0;
    if (0 < nVars) {
      uVar4 = (ulong)(uint)nVars;
    }
    do {
      if (uVar7 == uVar4) {
        __assert_fail("iVar < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x582,"int Abc_TtHasVar(word *, int, int)");
      }
      if (6 < nVars) {
        if (uVar7 < 6) {
          if (iVar6 != 0x1f) {
            uVar11 = 0;
            while (((*(ulong *)(pTruth + uVar11 * 2) >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^
                    *(ulong *)(pTruth + uVar11 * 2)) & s_Truths6Neg[uVar7]) == 0) {
              uVar11 = uVar11 + 1;
              if (uVar1 == uVar11) goto LAB_00414326;
            }
            goto LAB_0041426b;
          }
        }
        else if (iVar6 != 0x1f) {
          bVar3 = (byte)(uVar7 - 6);
          uVar9 = 1 << (bVar3 & 0x1f);
          uVar11 = 1;
          if (1 < (int)uVar9) {
            uVar11 = (ulong)uVar9;
          }
          lVar10 = (long)(2 << (bVar3 & 0x1f));
          puVar12 = pTruth + (long)(int)uVar9 * 2;
          puVar5 = pTruth;
          do {
            if (uVar7 - 6 != 0x1f) {
              uVar13 = 0;
              do {
                if (*(long *)(puVar5 + uVar13 * 2) != *(long *)(puVar12 + uVar13 * 2))
                goto LAB_0041426b;
                uVar13 = uVar13 + 1;
              } while (uVar11 != uVar13);
            }
            puVar5 = puVar5 + lVar10 * 2;
            puVar12 = puVar12 + lVar10 * 2;
          } while (puVar5 < pTruth + (long)(int)uVar8 * 2);
        }
LAB_00414326:
        bVar14 = false;
        goto LAB_00414381;
      }
      if ((s_Truths6Neg[uVar7] &
          (*(ulong *)pTruth >> ((byte)(1 << ((byte)uVar7 & 0x1f)) & 0x3f) ^ *(ulong *)pTruth)) == 0)
      goto LAB_00414326;
LAB_0041426b:
      uVar7 = uVar7 + 1;
    } while (uVar7 != (uint)nLeaves);
  }
  bVar14 = true;
  if (4 < nLeaves) {
    if (nLeaves == 7) {
      local_48 = *(word *)pTruth;
      local_40 = *(undefined8 *)(pTruth + 2);
      wVar2 = If_Dec7Perform(&local_48,0);
    }
    else if (nLeaves == 6) {
      wVar2 = If_Dec6Perform(*(word *)pTruth,0);
    }
    else {
      if (nLeaves != 5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x45b,
                      "int If_CutPerformCheck07(If_Man_t *, unsigned int *, int, int, char *)");
      }
      wVar2 = If_Dec5Perform(CONCAT44(*pTruth,*pTruth),0);
    }
    bVar14 = wVar2 != 0;
  }
LAB_00414381:
  return (int)bVar14;
}

Assistant:

int If_CutPerformCheck07( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    int fDerive = 0;
    int v;
    // skip non-support minimal
    for ( v = 0; v < nLeaves; v++ )
        if ( !Abc_TtHasVar( (word *)pTruth, nVars, v ) )
            return 0;
    // check
    if ( nLeaves < 5 )
        return 1;
    if ( nLeaves == 5 )
    {
        word z, t = ((word)pTruth[0] << 32) | (word)pTruth[0];
        z = If_Dec5Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec6Verify( t, z );
        return z != 0;
    }
    if ( nLeaves == 6 )
    {
        word z, t = ((word *)pTruth)[0];
        z = If_Dec6Perform( t, fDerive );
        if ( fDerive && z )
        {
//            If_DecPrintConfig( z );
            If_Dec6Verify( t, z );
        }
//        if ( z == 0 )
//            Extra_PrintHex(stdout, (unsigned *)&t, 6), printf( "  " ), Kit_DsdPrintFromTruth( (unsigned *)&t, 6 ), printf( "\n" );
        return z != 0;
    }
    if ( nLeaves == 7 )
    {
        word z, t[2];
        t[0] = ((word *)pTruth)[0];
        t[1] = ((word *)pTruth)[1];
//        if ( If_Dec7CheckMux(t) >= 0 )
//            return 1;
        z = If_Dec7Perform( t, fDerive );
        if ( fDerive && z )
            If_Dec7Verify( t, z );
        return z != 0;
    }
    assert( 0 );
    return 0;
}